

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O1

bool __thiscall cppurses::Text_display::paint_event(Text_display *this)

{
  pointer pLVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
  __first;
  long lVar6;
  size_t sVar7;
  pointer pLVar8;
  Painter p;
  allocator_type local_81;
  size_t local_80;
  pointer local_78;
  vector<cppurses::Glyph,std::allocator<cppurses::Glyph>> local_70 [24];
  Painter local_58;
  
  Painter::Painter(&local_58,&this->super_Widget);
  sVar7 = this->top_line_;
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->display_state_).
             super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pLVar8 = pLVar1 + sVar7;
  lVar6 = (long)local_78 - (long)pLVar1;
  sVar5 = (this->super_Widget).outer_height_;
  sVar3 = detail::Border_offset::north(&this->super_Widget);
  sVar4 = detail::Border_offset::south(&this->super_Widget);
  if ((sVar7 + sVar5) - (sVar4 + sVar3) < (ulong)(lVar6 >> 4)) {
    sVar7 = (this->super_Widget).outer_height_;
    sVar5 = detail::Border_offset::north(&this->super_Widget);
    sVar3 = detail::Border_offset::south(&this->super_Widget);
    local_78 = pLVar8 + (sVar7 - (sVar3 + sVar5));
  }
  if ((this->top_line_ <
       (ulong)((long)(this->display_state_).
                     super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->display_state_).
                     super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4)) && (pLVar8 != local_78)) {
    sVar7 = 0;
    do {
      sVar5 = pLVar8->length;
      __first._M_current =
           (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start + pLVar8->start_index;
      if (this->alignment_ == Right) {
        sVar3 = (this->super_Widget).outer_width_;
        local_80 = detail::Border_offset::east(&this->super_Widget);
        sVar4 = detail::Border_offset::west(&this->super_Widget);
        sVar3 = sVar3 - (sVar4 + local_80 + pLVar8->length);
      }
      else if (this->alignment_ == Center) {
        sVar3 = (this->super_Widget).outer_width_;
        local_80 = detail::Border_offset::east(&this->super_Widget);
        sVar4 = detail::Border_offset::west(&this->super_Widget);
        sVar3 = sVar3 - (sVar4 + local_80 + pLVar8->length) >> 1;
      }
      else {
        sVar3 = 0;
      }
      std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>::
      vector<__gnu_cxx::__normal_iterator<cppurses::Glyph*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>,void>
                (local_70,__first,__first._M_current + sVar5,&local_81);
      Painter::put(&local_58,(Glyph_string *)local_70,sVar3,sVar7);
      sVar7 = sVar7 + 1;
      std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::~vector
                ((vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> *)local_70);
      pLVar8 = pLVar8 + 1;
    } while (pLVar8 != local_78);
  }
  bVar2 = Widget::paint_event(&this->super_Widget);
  return bVar2;
}

Assistant:

bool Text_display::paint_event() {
    Painter p{*this};
    std::size_t line_n{0};
    auto paint = [&p, &line_n, this](const Line_info& line) {
        auto sub_begin = std::begin(this->contents_) + line.start_index;
        auto sub_end = sub_begin + line.length;
        std::size_t start{0};
        switch (alignment_) {
            case Alignment::Left:
                start = 0;
                break;
            case Alignment::Center:
                start = (this->width() - line.length) / 2;
                break;
            case Alignment::Right:
                start = this->width() - line.length;
                break;
        }
        p.put(Glyph_string(sub_begin, sub_end), start, line_n++);
    };
    auto begin = std::begin(display_state_) + this->top_line();
    auto end = std::end(display_state_);
    if (display_state_.size() > this->top_line() + this->height()) {
        end = begin + this->height();  // maybe make this the initial value?
    }
    if (this->top_line() < display_state_.size()) {
        std::for_each(begin, end, paint);
    }
    return Widget::paint_event();
}